

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  bool bVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [12];
  char cVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  NodeRef *pNVar20;
  ulong uVar21;
  ulong uVar22;
  ulong unaff_R15;
  byte bVar23;
  ulong uVar24;
  int iVar25;
  int iVar50;
  int iVar51;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  int iVar52;
  int iVar56;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  vfloat4 a0;
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      aVar7 = (ray->dir).field_0.field_1;
      auVar64 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar13 = ZEXT812(0) << 0x20;
      auVar60 = ZEXT816(0) << 0x40;
      auVar61._4_12_ = auVar13;
      auVar61._0_4_ = auVar64._0_4_;
      auVar26 = vrsqrt14ss_avx512f(auVar60,auVar61);
      fVar59 = auVar26._0_4_;
      pre.depth_scale = fVar59 * 1.5 - auVar64._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
      auVar67._0_4_ = aVar7.x * pre.depth_scale;
      auVar67._4_4_ = aVar7.y * pre.depth_scale;
      auVar67._8_4_ = aVar7.z * pre.depth_scale;
      auVar67._12_4_ = aVar7.field_3.w * pre.depth_scale;
      auVar26 = vshufpd_avx(auVar67,auVar67,1);
      auVar64 = vmovshdup_avx(auVar67);
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar39._16_4_ = 0x80000000;
      auVar39._0_16_ = auVar58;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar72._0_4_ = auVar64._0_4_ ^ 0x80000000;
      auVar64 = vunpckhps_avx(auVar67,auVar60);
      auVar72._4_12_ = auVar13;
      auVar29 = vshufps_avx(auVar64,auVar72,0x41);
      auVar70._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar70._8_8_ = auVar26._8_8_ ^ auVar58._8_8_;
      auVar28 = vinsertps_avx(auVar70,auVar67,0x2a);
      auVar64 = vdpps_avx(auVar29,auVar29,0x7f);
      auVar26 = vdpps_avx(auVar28,auVar28,0x7f);
      uVar10 = vcmpps_avx512vl(auVar26,auVar64,1);
      auVar64 = vpmovm2d_avx512vl(uVar10);
      auVar73._0_4_ = auVar64._0_4_;
      auVar73._4_4_ = auVar73._0_4_;
      auVar73._8_4_ = auVar73._0_4_;
      auVar73._12_4_ = auVar73._0_4_;
      uVar24 = vpmovd2m_avx512vl(auVar73);
      auVar64 = vpcmpeqd_avx(auVar73,auVar73);
      auVar27._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar64._4_4_;
      auVar27._0_4_ = (uint)((byte)uVar24 & 1) * auVar64._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar64._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar64._12_4_;
      auVar64 = vblendvps_avx(auVar28,auVar29,auVar27);
      auVar26 = vdpps_avx(auVar64,auVar64,0x7f);
      auVar74._4_12_ = auVar13;
      auVar74._0_4_ = auVar26._0_4_;
      auVar28 = vrsqrt14ss_avx512f(auVar60,auVar74);
      fVar59 = auVar28._0_4_;
      fVar59 = fVar59 * 1.5 - auVar26._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
      auVar71._0_4_ = auVar64._0_4_ * fVar59;
      auVar71._4_4_ = auVar64._4_4_ * fVar59;
      auVar71._8_4_ = auVar64._8_4_ * fVar59;
      auVar71._12_4_ = auVar64._12_4_ * fVar59;
      auVar64 = vshufps_avx(auVar71,auVar71,0xc9);
      auVar26 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar75._0_4_ = auVar71._0_4_ * auVar26._0_4_;
      auVar75._4_4_ = auVar71._4_4_ * auVar26._4_4_;
      auVar75._8_4_ = auVar71._8_4_ * auVar26._8_4_;
      auVar75._12_4_ = auVar71._12_4_ * auVar26._12_4_;
      auVar64 = vfmsub231ps_fma(auVar75,auVar67,auVar64);
      auVar26 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vdpps_avx(auVar26,auVar26,0x7f);
      auVar62._4_12_ = auVar13;
      auVar62._0_4_ = auVar64._0_4_;
      auVar28 = vrsqrt14ss_avx512f(auVar60,auVar62);
      fVar59 = auVar28._0_4_;
      fVar59 = fVar59 * 1.5 - auVar64._0_4_ * 0.5 * fVar59 * fVar59 * fVar59;
      auVar63._0_4_ = auVar26._0_4_ * fVar59;
      auVar63._4_4_ = auVar26._4_4_ * fVar59;
      auVar63._8_4_ = auVar26._8_4_ * fVar59;
      auVar63._12_4_ = auVar26._12_4_ * fVar59;
      auVar64._0_4_ = auVar67._0_4_ * pre.depth_scale;
      auVar64._4_4_ = auVar67._4_4_ * pre.depth_scale;
      auVar64._8_4_ = auVar67._8_4_ * pre.depth_scale;
      auVar64._12_4_ = auVar67._12_4_ * pre.depth_scale;
      auVar28 = vunpcklps_avx(auVar71,auVar64);
      auVar64 = vunpckhps_avx(auVar71,auVar64);
      auVar29 = vunpcklps_avx(auVar63,auVar60);
      auVar26 = vunpckhps_avx(auVar63,auVar60);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar64,auVar26);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar28,auVar29);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar28,auVar29);
      pNVar20 = stack + 1;
      auVar64 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx512vl((undefined1  [16])aVar7,auVar26);
      auVar60._8_4_ = 0x219392ef;
      auVar60._0_8_ = 0x219392ef219392ef;
      auVar60._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar26,auVar60,1);
      bVar8 = (bool)((byte)uVar24 & 1);
      auVar29._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.x;
      bVar8 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.y;
      bVar8 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.z;
      bVar8 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar7.field_3.a;
      auVar26 = vrcp14ps_avx512vl(auVar29);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = &DAT_3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28 = vfnmadd213ps_avx512vl(auVar29,auVar26,auVar28);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar29 = vfmadd132ps_fma(auVar28,auVar26,auVar26);
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar30 = vbroadcastss_avx512vl(auVar29);
      auVar26 = vmovshdup_avx(auVar29);
      auVar31 = vbroadcastsd_avx512vl(auVar26);
      auVar28 = vshufpd_avx(auVar29,auVar29,1);
      auVar33._8_4_ = 2;
      auVar33._0_8_ = 0x200000002;
      auVar33._12_4_ = 2;
      auVar33._16_4_ = 2;
      auVar33._20_4_ = 2;
      auVar33._24_4_ = 2;
      auVar33._28_4_ = 2;
      auVar32 = vpermps_avx512vl(auVar33,ZEXT1632(auVar29));
      fVar59 = auVar29._0_4_ * (ray->org).field_0.m128[0];
      auVar35._4_4_ = fVar59;
      auVar35._0_4_ = fVar59;
      auVar35._8_4_ = fVar59;
      auVar35._12_4_ = fVar59;
      auVar35._16_4_ = fVar59;
      auVar35._20_4_ = fVar59;
      auVar35._24_4_ = fVar59;
      auVar35._28_4_ = fVar59;
      auVar36._8_4_ = 1;
      auVar36._0_8_ = 0x100000001;
      auVar36._12_4_ = 1;
      auVar36._16_4_ = 1;
      auVar36._20_4_ = 1;
      auVar36._24_4_ = 1;
      auVar36._28_4_ = 1;
      auVar37 = ZEXT1632(CONCAT412(auVar29._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar29._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar29._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar59))));
      auVar36 = vpermps_avx2(auVar36,auVar37);
      auVar68 = ZEXT3264(auVar36);
      auVar37 = vpermps_avx2(auVar33,auVar37);
      uVar24 = (ulong)(auVar29._0_4_ < 0.0) * 0x20;
      uVar21 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x40;
      uVar22 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
      auVar33 = vbroadcastss_avx512vl(auVar64);
      auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar35 = vxorps_avx512vl(auVar35,auVar39);
      auVar36 = vxorps_avx512vl(auVar36,auVar39);
      auVar37 = vxorps_avx512vl(auVar37,auVar39);
      do {
        if (pNVar20 == stack) {
          return;
        }
        uVar17 = pNVar20[-1].ptr;
        pNVar20 = pNVar20 + -1;
        do {
          if ((uVar17 & 8) == 0) {
            fVar59 = (ray->dir).field_0.m128[3];
            uVar18 = (uint)uVar17 & 7;
            uVar15 = uVar17 & 0xfffffffffffffff0;
            if (uVar18 == 3) {
              auVar76._4_4_ = fVar59;
              auVar76._0_4_ = fVar59;
              auVar76._8_4_ = fVar59;
              auVar76._12_4_ = fVar59;
              auVar76._16_4_ = fVar59;
              auVar76._20_4_ = fVar59;
              auVar76._24_4_ = fVar59;
              auVar76._28_4_ = fVar59;
              fVar9 = 1.0 - fVar59;
              auVar65._0_4_ = fVar59 * *(float *)(uVar15 + 0x1c0);
              auVar65._4_4_ = fVar59 * *(float *)(uVar15 + 0x1c4);
              auVar65._8_4_ = fVar59 * *(float *)(uVar15 + 0x1c8);
              auVar65._12_4_ = fVar59 * *(float *)(uVar15 + 0x1cc);
              auVar65._16_4_ = fVar59 * *(float *)(uVar15 + 0x1d0);
              auVar65._20_4_ = fVar59 * *(float *)(uVar15 + 0x1d4);
              auVar65._24_4_ = fVar59 * *(float *)(uVar15 + 0x1d8);
              auVar65._28_4_ = 0;
              auVar66._0_4_ = fVar59 * *(float *)(uVar15 + 0x1e0);
              auVar66._4_4_ = fVar59 * *(float *)(uVar15 + 0x1e4);
              auVar66._8_4_ = fVar59 * *(float *)(uVar15 + 0x1e8);
              auVar66._12_4_ = fVar59 * *(float *)(uVar15 + 0x1ec);
              auVar66._16_4_ = fVar59 * *(float *)(uVar15 + 0x1f0);
              auVar66._20_4_ = fVar59 * *(float *)(uVar15 + 500);
              auVar66._24_4_ = fVar59 * *(float *)(uVar15 + 0x1f8);
              auVar66._28_4_ = 0;
              auVar69._0_4_ = fVar59 * *(float *)(uVar15 + 0x200);
              auVar69._4_4_ = fVar59 * *(float *)(uVar15 + 0x204);
              auVar69._8_4_ = fVar59 * *(float *)(uVar15 + 0x208);
              auVar69._12_4_ = fVar59 * *(float *)(uVar15 + 0x20c);
              auVar69._16_4_ = fVar59 * *(float *)(uVar15 + 0x210);
              auVar69._20_4_ = fVar59 * *(float *)(uVar15 + 0x214);
              auVar69._28_36_ = auVar68._28_36_;
              auVar69._24_4_ = fVar59 * *(float *)(uVar15 + 0x218);
              auVar80._4_4_ = fVar9;
              auVar80._0_4_ = fVar9;
              auVar80._8_4_ = fVar9;
              auVar80._12_4_ = fVar9;
              auVar80._16_4_ = fVar9;
              auVar80._20_4_ = fVar9;
              auVar80._24_4_ = fVar9;
              auVar80._28_4_ = fVar9;
              auVar78._0_12_ = ZEXT812(0);
              auVar78._12_4_ = 0;
              auVar64 = vfmadd231ps_fma(auVar65,auVar80,ZEXT1632(auVar78));
              auVar26 = vfmadd231ps_fma(auVar66,auVar80,ZEXT1632(auVar78));
              auVar28 = vfmadd231ps_fma(auVar69._0_32_,auVar80,ZEXT1632(auVar78));
              auVar68 = ZEXT1664(auVar28);
              auVar39 = vmulps_avx512vl(auVar76,*(undefined1 (*) [32])(uVar15 + 0x260));
              auVar77._0_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x220);
              auVar77._4_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x224);
              auVar77._8_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x228);
              auVar77._12_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x22c);
              auVar77._16_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x230);
              auVar77._20_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x234);
              auVar77._24_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x238);
              auVar77._28_4_ = fVar9 + 0.0;
              auVar79._0_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x240);
              auVar79._4_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x244);
              auVar79._8_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x248);
              auVar79._12_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x24c);
              auVar79._16_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x250);
              auVar79._20_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 0x254);
              auVar79._24_4_ = fVar9 + fVar59 * *(float *)(uVar15 + 600);
              auVar79._28_4_ = fVar9 + in_ZMM15._28_4_;
              auVar43 = vaddps_avx512vl(auVar80,auVar39);
              auVar45._4_4_ = uVar3;
              auVar45._0_4_ = uVar3;
              auVar45._8_4_ = uVar3;
              auVar45._12_4_ = uVar3;
              auVar45._16_4_ = uVar3;
              auVar45._20_4_ = uVar3;
              auVar45._24_4_ = uVar3;
              auVar45._28_4_ = uVar3;
              auVar39 = vmulps_avx512vl(auVar45,*(undefined1 (*) [32])(uVar15 + 0x100));
              auVar40 = vmulps_avx512vl(auVar45,*(undefined1 (*) [32])(uVar15 + 0x120));
              auVar38 = vmulps_avx512vl(auVar45,*(undefined1 (*) [32])(uVar15 + 0x140));
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              auVar46._16_4_ = uVar2;
              auVar46._20_4_ = uVar2;
              auVar46._24_4_ = uVar2;
              auVar46._28_4_ = uVar2;
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar46,*(undefined1 (*) [32])(uVar15 + 0xa0));
              auVar40 = vfmadd231ps_avx512vl(auVar40,auVar46,*(undefined1 (*) [32])(uVar15 + 0xc0));
              auVar38 = vfmadd231ps_avx512vl(auVar38,auVar46,*(undefined1 (*) [32])(uVar15 + 0xe0));
              auVar47._4_4_ = uVar1;
              auVar47._0_4_ = uVar1;
              auVar47._8_4_ = uVar1;
              auVar47._12_4_ = uVar1;
              auVar47._16_4_ = uVar1;
              auVar47._20_4_ = uVar1;
              auVar47._24_4_ = uVar1;
              auVar47._28_4_ = uVar1;
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar47,*(undefined1 (*) [32])(uVar15 + 0x40));
              auVar40 = vfmadd231ps_avx512vl(auVar40,auVar47,*(undefined1 (*) [32])(uVar15 + 0x60));
              auVar38 = vfmadd231ps_avx512vl(auVar38,auVar47,*(undefined1 (*) [32])(uVar15 + 0x80));
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar39,auVar41);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar16 = vcmpps_avx512vl(auVar41,auVar42,1);
              bVar8 = (bool)((byte)uVar16 & 1);
              iVar25 = auVar42._0_4_;
              auVar48._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar39._0_4_;
              bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
              iVar50 = auVar42._4_4_;
              auVar48._4_4_ = (uint)bVar8 * iVar50 | (uint)!bVar8 * auVar39._4_4_;
              bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
              iVar51 = auVar42._8_4_;
              auVar48._8_4_ = (uint)bVar8 * iVar51 | (uint)!bVar8 * auVar39._8_4_;
              bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
              iVar52 = auVar42._12_4_;
              auVar48._12_4_ = (uint)bVar8 * iVar52 | (uint)!bVar8 * auVar39._12_4_;
              bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
              iVar53 = auVar42._16_4_;
              auVar48._16_4_ = (uint)bVar8 * iVar53 | (uint)!bVar8 * auVar39._16_4_;
              bVar8 = (bool)((byte)(uVar16 >> 5) & 1);
              iVar54 = auVar42._20_4_;
              auVar48._20_4_ = (uint)bVar8 * iVar54 | (uint)!bVar8 * auVar39._20_4_;
              bVar8 = (bool)((byte)(uVar16 >> 6) & 1);
              iVar55 = auVar42._24_4_;
              iVar56 = auVar42._28_4_;
              auVar48._24_4_ = (uint)bVar8 * iVar55 | (uint)!bVar8 * auVar39._24_4_;
              bVar8 = SUB81(uVar16 >> 7,0);
              auVar48._28_4_ = (uint)bVar8 * iVar56 | (uint)!bVar8 * auVar39._28_4_;
              vandps_avx512vl(auVar40,auVar41);
              uVar16 = vcmpps_avx512vl(auVar48,auVar42,1);
              bVar8 = (bool)((byte)uVar16 & 1);
              auVar49._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar40._0_4_;
              bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
              auVar49._4_4_ = (uint)bVar8 * iVar50 | (uint)!bVar8 * auVar40._4_4_;
              bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
              auVar49._8_4_ = (uint)bVar8 * iVar51 | (uint)!bVar8 * auVar40._8_4_;
              bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
              auVar49._12_4_ = (uint)bVar8 * iVar52 | (uint)!bVar8 * auVar40._12_4_;
              bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
              auVar49._16_4_ = (uint)bVar8 * iVar53 | (uint)!bVar8 * auVar40._16_4_;
              bVar8 = (bool)((byte)(uVar16 >> 5) & 1);
              auVar49._20_4_ = (uint)bVar8 * iVar54 | (uint)!bVar8 * auVar40._20_4_;
              bVar8 = (bool)((byte)(uVar16 >> 6) & 1);
              auVar49._24_4_ = (uint)bVar8 * iVar55 | (uint)!bVar8 * auVar40._24_4_;
              bVar8 = SUB81(uVar16 >> 7,0);
              auVar49._28_4_ = (uint)bVar8 * iVar56 | (uint)!bVar8 * auVar40._28_4_;
              vandps_avx512vl(auVar38,auVar41);
              uVar16 = vcmpps_avx512vl(auVar49,auVar42,1);
              bVar8 = (bool)((byte)uVar16 & 1);
              auVar44._0_4_ = (uint)bVar8 * iVar25 | (uint)!bVar8 * auVar38._0_4_;
              bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
              auVar44._4_4_ = (uint)bVar8 * iVar50 | (uint)!bVar8 * auVar38._4_4_;
              bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
              auVar44._8_4_ = (uint)bVar8 * iVar51 | (uint)!bVar8 * auVar38._8_4_;
              bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
              auVar44._12_4_ = (uint)bVar8 * iVar52 | (uint)!bVar8 * auVar38._12_4_;
              bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
              auVar44._16_4_ = (uint)bVar8 * iVar53 | (uint)!bVar8 * auVar38._16_4_;
              bVar8 = (bool)((byte)(uVar16 >> 5) & 1);
              auVar44._20_4_ = (uint)bVar8 * iVar54 | (uint)!bVar8 * auVar38._20_4_;
              bVar8 = (bool)((byte)(uVar16 >> 6) & 1);
              auVar44._24_4_ = (uint)bVar8 * iVar55 | (uint)!bVar8 * auVar38._24_4_;
              bVar8 = SUB81(uVar16 >> 7,0);
              auVar44._28_4_ = (uint)bVar8 * iVar56 | (uint)!bVar8 * auVar38._28_4_;
              auVar39 = vrcp14ps_avx512vl(auVar48);
              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar38 = vfnmadd213ps_avx512vl(auVar48,auVar39,auVar40);
              auVar45 = vfmadd132ps_avx512vl(auVar38,auVar39,auVar39);
              in_ZMM15 = ZEXT3264(auVar45);
              auVar39 = vrcp14ps_avx512vl(auVar49);
              auVar38 = vfnmadd213ps_avx512vl(auVar49,auVar39,auVar40);
              auVar46 = vfmadd132ps_avx512vl(auVar38,auVar39,auVar39);
              auVar39 = vrcp14ps_avx512vl(auVar44);
              auVar40 = vfnmadd213ps_avx512vl(auVar44,auVar39,auVar40);
              auVar47 = vfmadd132ps_avx512vl(auVar40,auVar39,auVar39);
              auVar40._4_4_ = uVar6;
              auVar40._0_4_ = uVar6;
              auVar40._8_4_ = uVar6;
              auVar40._12_4_ = uVar6;
              auVar40._16_4_ = uVar6;
              auVar40._20_4_ = uVar6;
              auVar40._24_4_ = uVar6;
              auVar40._28_4_ = uVar6;
              auVar39 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar15 + 0x100),auVar40,
                                   *(undefined1 (*) [32])(uVar15 + 0x160));
              auVar41 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar15 + 0x120),auVar40,
                                   *(undefined1 (*) [32])(uVar15 + 0x180));
              auVar40 = vfmadd213ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar15 + 0x140),auVar40,
                                   *(undefined1 (*) [32])(uVar15 + 0x1a0));
              auVar38._4_4_ = uVar5;
              auVar38._0_4_ = uVar5;
              auVar38._8_4_ = uVar5;
              auVar38._12_4_ = uVar5;
              auVar38._16_4_ = uVar5;
              auVar38._20_4_ = uVar5;
              auVar38._24_4_ = uVar5;
              auVar38._28_4_ = uVar5;
              auVar39 = vfmadd231ps_avx512vl(auVar39,auVar38,*(undefined1 (*) [32])(uVar15 + 0xa0));
              auVar41 = vfmadd231ps_avx512vl(auVar41,auVar38,*(undefined1 (*) [32])(uVar15 + 0xc0));
              auVar40 = vfmadd231ps_avx512vl(auVar40,auVar38,*(undefined1 (*) [32])(uVar15 + 0xe0));
              auVar42._4_4_ = uVar4;
              auVar42._0_4_ = uVar4;
              auVar42._8_4_ = uVar4;
              auVar42._12_4_ = uVar4;
              auVar42._16_4_ = uVar4;
              auVar42._20_4_ = uVar4;
              auVar42._24_4_ = uVar4;
              auVar42._28_4_ = uVar4;
              auVar29 = vfmadd231ps_fma(auVar39,auVar42,*(undefined1 (*) [32])(uVar15 + 0x40));
              auVar27 = vfmadd231ps_fma(auVar41,auVar42,*(undefined1 (*) [32])(uVar15 + 0x60));
              auVar58 = vfmadd231ps_fma(auVar40,auVar42,*(undefined1 (*) [32])(uVar15 + 0x80));
              auVar39 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar29));
              auVar40 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar27));
              auVar38 = vsubps_avx(ZEXT1632(auVar28),ZEXT1632(auVar58));
              auVar41._4_4_ = auVar45._4_4_ * auVar39._4_4_;
              auVar41._0_4_ = auVar45._0_4_ * auVar39._0_4_;
              auVar41._8_4_ = auVar45._8_4_ * auVar39._8_4_;
              auVar41._12_4_ = auVar45._12_4_ * auVar39._12_4_;
              auVar41._16_4_ = auVar45._16_4_ * auVar39._16_4_;
              auVar41._20_4_ = auVar45._20_4_ * auVar39._20_4_;
              auVar41._24_4_ = auVar45._24_4_ * auVar39._24_4_;
              auVar41._28_4_ = auVar39._28_4_;
              auVar48 = vmulps_avx512vl(auVar40,auVar46);
              auVar49 = vmulps_avx512vl(auVar38,auVar47);
              auVar39 = vsubps_avx(auVar77,ZEXT1632(auVar29));
              auVar40 = vsubps_avx(auVar79,ZEXT1632(auVar27));
              auVar38 = vsubps_avx(auVar43,ZEXT1632(auVar58));
              auVar43._4_4_ = auVar45._4_4_ * auVar39._4_4_;
              auVar43._0_4_ = auVar45._0_4_ * auVar39._0_4_;
              auVar43._8_4_ = auVar45._8_4_ * auVar39._8_4_;
              auVar43._12_4_ = auVar45._12_4_ * auVar39._12_4_;
              auVar43._16_4_ = auVar45._16_4_ * auVar39._16_4_;
              auVar43._20_4_ = auVar45._20_4_ * auVar39._20_4_;
              auVar43._24_4_ = auVar45._24_4_ * auVar39._24_4_;
              auVar43._28_4_ = auVar39._28_4_;
              auVar45 = vmulps_avx512vl(auVar40,auVar46);
              auVar46 = vmulps_avx512vl(auVar38,auVar47);
              auVar42 = vpminsd_avx2(auVar41,auVar43);
              auVar39 = vpminsd_avx2(auVar48,auVar45);
              auVar40 = vpminsd_avx2(auVar49,auVar46);
              auVar39 = vmaxps_avx(auVar39,auVar40);
              auVar38 = vpmaxsd_avx2(auVar41,auVar43);
              auVar40 = vpmaxsd_avx2(auVar48,auVar45);
              auVar41 = vpmaxsd_avx2(auVar49,auVar46);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar41 = vmaxps_avx512vl(auVar33,auVar42);
              auVar39 = vmaxps_avx(auVar41,auVar39);
              auVar38 = vminps_avx512vl(auVar34,auVar38);
              auVar40 = vminps_avx(auVar38,auVar40);
              uVar10 = vcmpps_avx512vl(auVar39,auVar40,2);
              bVar23 = (byte)uVar10;
            }
            else {
              auVar57._4_4_ = fVar59;
              auVar57._0_4_ = fVar59;
              auVar57._8_4_ = fVar59;
              auVar57._12_4_ = fVar59;
              auVar57._16_4_ = fVar59;
              auVar57._20_4_ = fVar59;
              auVar57._24_4_ = fVar59;
              auVar57._28_4_ = fVar59;
              auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar24),auVar57,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar24));
              auVar38 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar30,auVar35);
              auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar21),auVar57,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar21));
              auVar26 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar22),auVar57,
                                        *(undefined1 (*) [32])(uVar15 + 0x40 + uVar22));
              auVar39 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar31,auVar36);
              auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar26),auVar32,auVar37);
              auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar24 ^ 0x20)),
                                        auVar57,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar24 ^ 0x20)));
              auVar39 = vmaxps_avx(auVar39,auVar40);
              auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar30,auVar35);
              auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar21 ^ 0x20)),
                                        auVar57,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar21 ^ 0x20)));
              auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar31,auVar36);
              auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar22 ^ 0x20)),
                                        auVar57,*(undefined1 (*) [32])
                                                 (uVar15 + 0x40 + (uVar22 ^ 0x20)));
              auVar42 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar32,auVar37);
              auVar40 = vminps_avx(auVar40,auVar42);
              auVar38 = vmaxps_avx512vl(auVar33,auVar38);
              auVar39 = vmaxps_avx(auVar38,auVar39);
              auVar38 = vminps_avx512vl(auVar34,auVar41);
              auVar40 = vminps_avx(auVar38,auVar40);
              if (uVar18 == 6) {
                uVar10 = vcmpps_avx512vl(auVar39,auVar40,2);
                uVar11 = vcmpps_avx512vl(auVar57,*(undefined1 (*) [32])(uVar15 + 0x1c0),0xd);
                uVar12 = vcmpps_avx512vl(auVar57,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
                bVar23 = (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
              }
              else {
                uVar10 = vcmpps_avx512vl(auVar39,auVar40,2);
                bVar23 = (byte)uVar10;
              }
            }
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar23);
          }
          if ((uVar17 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar25 = 4;
            }
            else {
              uVar15 = uVar17 & 0xfffffffffffffff0;
              lVar19 = 0;
              for (uVar17 = unaff_R15; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
              {
                lVar19 = lVar19 + 1;
              }
              iVar25 = 0;
              for (uVar16 = unaff_R15 - 1 & unaff_R15; uVar17 = *(ulong *)(uVar15 + lVar19 * 8),
                  uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
                pNVar20->ptr = uVar17;
                pNVar20 = pNVar20 + 1;
                lVar19 = 0;
                for (uVar17 = uVar16; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
                {
                  lVar19 = lVar19 + 1;
                }
              }
            }
          }
          else {
            iVar25 = 6;
          }
        } while (iVar25 == 0);
        if (iVar25 == 6) {
          auVar68 = ZEXT1664(auVar68._0_16_);
          in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
          cVar14 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          iVar25 = 0;
          if (cVar14 != '\0') {
            ray->tfar = -INFINITY;
            iVar25 = 3;
          }
        }
      } while (iVar25 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }